

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::index_val_q
          (CVmObjStringBuffer *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  int iVar1;
  int iVar2;
  
  if (index_val->typ == VM_INT) {
    iVar1 = (index_val->val).intval;
  }
  else {
    iVar1 = vm_val_t::nonint_num_to_int(index_val);
  }
  iVar2 = -1;
  if (iVar1 < 0) {
    iVar2 = *(int *)(this->super_CVmObject).ext_;
  }
  iVar2 = iVar2 + iVar1;
  if ((-1 < iVar2) && (iVar2 < *(int *)(this->super_CVmObject).ext_)) {
    substr_to_string(this,result,iVar2,1);
    return 1;
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjStringBuffer::index_val_q(VMG_ vm_val_t *result, vm_obj_id_t self,
                                    const vm_val_t *index_val)
{
    /* get the index as an integer */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* adjust to zero-based indexing or a negative end-based index */
    idx += (idx < 0 ? get_ext()->len : -1);

    /* ensure idx is in range */
    if (idx < 0 || idx >= (int32_t)get_ext()->len)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* return a one-character string of the character at this index */
    substr_to_string(vmg_ result, idx, 1);

    /* handled */
    return TRUE;
}